

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O3

bool subhomedir(char *dst,int len,char *src)

{
  char *pcVar1;
  char *__src;
  size_t sVar2;
  bool bVar3;
  
  pcVar1 = strstr(src,"$HOME");
  if ((pcVar1 == (char *)0x0) && (pcVar1 = strchr(src,0x7e), pcVar1 == (char *)0x0)) {
    return true;
  }
  bVar3 = true;
  if ((long)pcVar1 - (long)src < (long)len) {
    __src = getenv("HOME");
    if ((__src == (char *)0x0) || (*__src == '\0')) {
      bVar3 = false;
    }
    else {
      dst[(long)pcVar1 - (long)src] = '\0';
      sVar2 = strlen(dst);
      if (sVar2 < 0x104) {
        strncpy(dst + sVar2,__src,0x104 - sVar2);
        dst[0x103] = '\0';
      }
      sVar2 = strlen(dst);
      if (sVar2 < 0x104) {
        strncpy(dst + sVar2,pcVar1 + (ulong)(*pcVar1 != '~') * 4 + 1,0x104 - sVar2);
        dst[0x103] = '\0';
      }
    }
  }
  return bVar3;
}

Assistant:

bool subhomedir(char *dst, int len, const char *src)
{
    const char *sub = strstr(src, "$HOME");
    if(!sub) sub = strchr(src, '~');
    if(sub && sub-src < len)
    {
#ifdef WIN32
        char home[MAX_PATH+1];
        home[0] = '\0';
        if(SHGetFolderPath(NULL, CSIDL_PERSONAL, NULL, 0, home) != S_OK || !home[0]) return false;
#else
        const char *home = getenv("HOME");
        if(!home || !home[0]) return false;
#endif
        dst[sub-src] = '\0';
        concatstring(dst, home);
        concatstring(dst, sub+(*sub == '~' ? 1 : strlen("$HOME")));
    }
    return true;
}